

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GatherNDLayerParams::GatherNDLayerParams
          (GatherNDLayerParams *this,GatherNDLayerParams *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__GatherNDLayerParams_004b8060;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

constexpr NeuralNetworkPreprocessing::NeuralNetworkPreprocessing(
  ::PROTOBUF_NAMESPACE_ID::internal::ConstantInitialized)
  : featurename_(&::PROTOBUF_NAMESPACE_ID::internal::fixed_address_empty_string)
  , _oneof_case_{}{}